

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
file_partial_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::get_partial(file_partial_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name)

{
  bool value;
  pointer ppVar1;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_basic_data<basic_string<char>_>_>_&&>::value,_pair<iterator,_bool>_>
  _Var2;
  basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_220;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
  local_1a0;
  undefined1 local_198;
  Decomposer local_18a;
  ExprLhs<bool> local_189;
  StringRef local_188;
  SourceLineInfo local_178;
  StringRef local_168;
  undefined1 local_158 [8];
  AssertionHandler catchAssertionHandler_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> result;
  Decomposer local_d1;
  _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_true>
  *local_d0;
  BinaryExpr<const_std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_true>_&,_const_std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_true>_&>
  local_c8;
  StringRef local_98;
  SourceLineInfo local_88;
  StringRef local_78;
  undefined1 local_68 [8];
  AssertionHandler catchAssertionHandler;
  iterator cached;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *name_local;
  file_partial_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  catchAssertionHandler.m_resultCapture =
       (IResultCapture *)
       Catch::clara::std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
       ::find(&this->cached_files_,name);
  local_78 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_88,
             "/workspace/llm4binary/github/license_c_cmakelists/kainjow[P]Mustache/tests/tests.cpp",
             0x485);
  Catch::StringRef::StringRef(&local_98,"cached == cached_files_.end()");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_68,&local_78,&local_88,local_98,Normal);
  local_d0 = (_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_true>
              *)Catch::Decomposer::operator<=
                          (&local_d1,
                           (_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_true>
                            *)&catchAssertionHandler.m_resultCapture);
  result.field_2._8_8_ =
       Catch::clara::std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
       ::end(&this->cached_files_);
  Catch::
  ExprLhs<std::__detail::_Node_iterator<std::pair<std::__cxx11::string_const,kainjow::mustache::basic_data<std::__cxx11::string>>,false,true>const&>
  ::operator==(&local_c8,
               (ExprLhs<std::__detail::_Node_iterator<std::pair<std::__cxx11::string_const,kainjow::mustache::basic_data<std::__cxx11::string>>,false,true>const&>
                *)&local_d0,
               (_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_true>
                *)((long)&result.field_2 + 8));
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_68,&local_c8.super_ITransientExpression);
  Catch::
  BinaryExpr<const_std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_true>_&,_const_std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_true>_&>
  ::~BinaryExpr(&local_c8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_68);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_68);
  std::__cxx11::string::string((string *)&catchAssertionHandler_1.m_resultCapture);
  local_168 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_178,
             "/workspace/llm4binary/github/license_c_cmakelists/kainjow[P]Mustache/tests/tests.cpp",
             0x487);
  Catch::StringRef::StringRef(&local_188,"read_file(name, result)");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_158,&local_168,&local_178,local_188,Normal);
  value = read_file(this,name,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &catchAssertionHandler_1.m_resultCapture);
  local_189 = Catch::Decomposer::operator<=(&local_18a,value);
  Catch::AssertionHandler::handleExpr<bool>((AssertionHandler *)local_158,&local_189);
  Catch::AssertionHandler::complete((AssertionHandler *)local_158);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_158);
  kainjow::mustache::
  basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  basic_data(&local_220,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &catchAssertionHandler_1.m_resultCapture);
  std::make_pair<std::__cxx11::string_const&,kainjow::mustache::basic_data<std::__cxx11::string>>
            (&local_1f0,name,&local_220);
  _Var2 = std::
          unordered_map<std::__cxx11::string,kainjow::mustache::basic_data<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,kainjow::mustache::basic_data<std::__cxx11::string>>>>
          ::
          insert<std::pair<std::__cxx11::string,kainjow::mustache::basic_data<std::__cxx11::string>>>
                    ((unordered_map<std::__cxx11::string,kainjow::mustache::basic_data<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,kainjow::mustache::basic_data<std::__cxx11::string>>>>
                      *)&this->cached_files_,&local_1f0);
  local_1a0._M_cur =
       (__node_type *)
       _Var2.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
       ._M_cur;
  local_198 = _Var2.second;
  ppVar1 = Catch::clara::std::__detail::
           _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_true>
           ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false,_true>
                         *)&local_1a0);
  Catch::clara::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kainjow::mustache::basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~pair(&local_1f0);
  kainjow::mustache::
  basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~basic_data(&local_220);
  std::__cxx11::string::~string((string *)&catchAssertionHandler_1.m_resultCapture);
  return &ppVar1->second;
}

Assistant:

virtual const basic_data<string_type>* get_partial(const string_type& name) const override {
        const auto cached = cached_files_.find(name);
        REQUIRE(cached == cached_files_.end());
        string_type result;
        REQUIRE(read_file(name, result));
        return &cached_files_.insert(std::make_pair(name, basic_data<string_type>(result))).first->second;
    }